

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringStreamTest.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  QTest local_28;
  
  Qentem::QTest::PrintInfo();
  local_28.part_name_ = (char *)0x0;
  local_28.test_name_ = "StringStream.hpp";
  local_28.file_fullname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HaniAmmar[P]Qentem-Engine/Tests/StringStreamTest.hpp"
  ;
  local_28.error_ = false;
  local_28.continue_on_error_ = false;
  Qentem::QTest::PrintGroupName(&local_28);
  Qentem::QTest::Test<char_const,void(*)(Qentem::QTest&)>
            (&local_28,"StringStream Test 1",Qentem::Test::TestStringStream1);
  Qentem::QTest::Test<char_const,void(*)(Qentem::QTest&)>
            (&local_28,"StringStream Test 2",Qentem::Test::TestStringStream2);
  iVar1 = Qentem::QTest::EndTests(&local_28);
  Qentem::MemoryRecord::PrintMemoryStatus();
  return iVar1;
}

Assistant:

int main() {
    Qentem::QTest::PrintInfo();
    const int ret = Qentem::Test::RunStringStreamTests();
    Qentem::MemoryRecord::PrintMemoryStatus();

    return ret;
}